

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O3

AssertionResult *
iutest::internal::CmpHelperNearFloatingPoint<double>
          (char *expr1,char *expr2,char *absc,double val1,double val2,double abs_v)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  AssertionResult *pAVar3;
  double *in_RCX;
  AssertionResult *in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double diff;
  floating_point<double> f2;
  floating_point<double> f1;
  FInt local_a8;
  internal local_a0 [8];
  double local_98;
  double local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  string local_70;
  AssertionResult local_50;
  _Myt local_28;
  FInt local_20;
  
  local_a8.uv = ~-(ulong)(in_XMM1_Qa < in_XMM0_Qa) & (ulong)(in_XMM1_Qa - in_XMM0_Qa) |
                (ulong)(in_XMM0_Qa - in_XMM1_Qa) & -(ulong)(in_XMM1_Qa < in_XMM0_Qa);
  if ((local_a8.fv < in_XMM2_Qa) ||
     (local_20.uv = local_a8.uv,
     bVar2 = floating_point<double>::AlmostEquals((floating_point<double> *)&local_20,&local_28),
     bVar2)) {
    (in_RDI->m_message)._M_dataplus._M_p = (pointer)&(in_RDI->m_message).field_2;
    (in_RDI->m_message)._M_string_length = 0;
    (in_RDI->m_message).field_2._M_local_buf[0] = '\0';
    in_RDI->m_result = true;
    return in_RDI;
  }
  paVar1 = &local_50.m_message.field_2;
  local_50.m_message._M_string_length = 0;
  local_50.m_message.field_2._M_local_buf[0] = '\0';
  local_50.m_result = false;
  local_50.m_message._M_dataplus._M_p = (pointer)paVar1;
  pAVar3 = AssertionResult::operator<<(&local_50,(char (*) [22])"error: Value of: abs(");
  pAVar3 = AssertionResult::operator<<(pAVar3,&local_78);
  pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [4])" - ");
  pAVar3 = AssertionResult::operator<<(pAVar3,&local_80);
  pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [6])") <= ");
  pAVar3 = AssertionResult::operator<<(pAVar3,&local_88);
  pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [16])"\n  Actual: abs(");
  pAVar3 = AssertionResult::operator<<(pAVar3,&local_90);
  pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [4])" - ");
  pAVar3 = AssertionResult::operator<<(pAVar3,&local_98);
  pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [5])") : ");
  pAVar3 = AssertionResult::operator<<(pAVar3,&local_a8.fv);
  pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [12])"\nExpected: ");
  FormatForComparisonFailureMessage<double,double>(&local_70,local_a0,&local_a8.fv,in_RCX);
  pAVar3 = AssertionResult::operator<<(pAVar3,&local_70);
  (in_RDI->m_message)._M_dataplus._M_p = (pointer)&(in_RDI->m_message).field_2;
  std::__cxx11::string::_M_construct<char*>();
  in_RDI->m_result = pAVar3->m_result;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.m_message._M_dataplus._M_p == paVar1) {
    return in_RDI;
  }
  operator_delete(local_50.m_message._M_dataplus._M_p,
                  CONCAT71(local_50.m_message.field_2._M_allocated_capacity._1_7_,
                           local_50.m_message.field_2._M_local_buf[0]) + 1);
  return in_RDI;
}

Assistant:

inline AssertionResult IUTEST_ATTRIBUTE_UNUSED_ CmpHelperNearFloatingPoint(
    const char* expr1, const char* expr2, const char* absc
        , RawType val1, RawType val2, RawType abs_v)
{
    const RawType diff = val1 > val2 ? val1 - val2 : val2 - val1;
    if IUTEST_COND_LIKELY( diff < abs_v )
    {
        return AssertionSuccess();
    }